

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_range.cpp
# Opt level: O3

ExprPtr __thiscall
mathiu::impl::functionRangeImpl(impl *this,ExprPtr *function,ExprPtr *symbol,ExprPtr *domain)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  variant_alternative_t<1UL,_variant<monostate,_const_pair<pair<shared_ptr<const_Expr>,_bool>,_pair<shared_ptr<const_Expr>,_bool>_>_*,_const_SetOp_*,_const_Union_*,_bool>_>
  *value;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> _Var4;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> *p_Var5;
  variant_alternative_t<3UL,_variant<monostate,_const_pair<pair<shared_ptr<const_Expr>,_bool>,_pair<shared_ptr<const_Expr>,_bool>_>_*,_const_SetOp_*,_const_Union_*,_bool>_>
  *value_00;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>_&>
  pIVar6;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Union,_mathiu::impl::Union_*,_const_mathiu::impl::Union_*>_&>
  pUVar7;
  _Base_ptr p_Var8;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> _Var9;
  logic_error *this_00;
  ExprPtr *ex;
  ExprPtr *ex_00;
  ExprPtr *ex_01;
  ExprPtr *ex_02;
  ExprPtr *ex_03;
  ExprPtr *ex_04;
  ExprPtr *ex_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  IdProcess idProcess;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Rb_tree_header *p_Var10;
  ExprPtr EVar11;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_4b8;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> _Stack_4b0;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> *local_4a0;
  impl *local_498;
  impl *local_490;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_488;
  long lStack_480;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_478;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  _Stack_470;
  undefined8 uStack_430;
  anon_class_1_0_00000001 *local_428;
  InternalPatternT<bool> IStack_420;
  undefined7 uStack_41f;
  anon_class_1_0_00000001 *local_418;
  InternalPatternT<bool> IStack_410;
  undefined7 uStack_40f;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_408;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> _Stack_400;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3f8;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_3f0;
  anon_class_1_0_00000001 *local_3a8;
  InternalPatternT<bool> IStack_3a0;
  undefined7 uStack_39f;
  string local_398;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_378;
  anon_class_1_0_00000001 *local_330;
  InternalPatternT<bool> IStack_328;
  undefined7 uStack_327;
  anon_class_1_0_00000001 *local_320;
  InternalPatternT<bool> IStack_318;
  undefined7 uStack_317;
  string local_308;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_2e8;
  anon_class_1_0_00000001 *local_2a0;
  InternalPatternT<bool> IStack_298;
  undefined7 uStack_297;
  anon_class_1_0_00000001 *local_290;
  InternalPatternT<bool> IStack_288;
  undefined7 uStack_287;
  undefined1 *local_278;
  undefined1 *local_270;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_260;
  impl *local_250;
  ExprPtr *local_248;
  ExprPtr *local_240;
  undefined1 local_238 [8];
  undefined1 auStack_230 [24];
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  _Stack_218;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_1d0;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_1c0;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  *local_1b0;
  impl *local_1a8;
  ExprPtr *local_1a0;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_190;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_188;
  anon_class_1_0_00000001 *local_140;
  InternalPatternT<bool> IStack_138;
  undefined7 uStack_137;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_130;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_d8 [9];
  anon_class_1_0_00000001 *local_90;
  InternalPatternT<bool> IStack_88;
  undefined7 uStack_87;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_78;
  undefined1 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"functionRangeImpl: ",0x13);
  local_498 = (impl *)function;
  toString_abi_cxx11_((string *)local_238,(impl *)function,ex);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_238,auStack_230._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\t",2);
  toString_abi_cxx11_(&local_308,(impl *)symbol,ex_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_308._M_dataplus._M_p,local_308._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\t",2);
  toString_abi_cxx11_(&local_398,(impl *)domain,ex_01);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_398._M_dataplus._M_p,local_398._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if (local_238 != (undefined1  [8])(auStack_230 + 8)) {
    operator_delete((void *)local_238,auStack_230._8_8_ + 1);
  }
  local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
  auStack_230._0_8_ = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
  auStack_230._8_8_ = 0;
  auStack_230._16_8_ = 0;
  _Stack_218._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>_*>)0x0;
  _Stack_218._8_8_ = 0;
  _Stack_218._16_8_ = 0;
  _Stack_218._24_8_ = 0;
  local_78._0_4_ = 0;
  local_78._M_first._M_storage._M_storage[0x38] = '\0';
  local_38 = 0;
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Union,_mathiu::impl::Union_*,_const_mathiu::impl::Union_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Union,_mathiu::impl::Union_*,_const_mathiu::impl::Union_*>
                       *)auStack_230);
  _Var9 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)
          (domain->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_278 = &matchit::impl::
               asPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
  ;
  local_270 = &matchit::impl::deref;
  local_260.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_260.mPattern = true;
  local_250 = local_498;
  local_490 = (impl *)domain;
  local_248 = symbol;
  local_240 = domain;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&local_130,(Id<mathiu::impl::Union> *)&local_78._M_first);
  matchit::impl::as<mathiu::impl::Union>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
              *)&local_e8._M_first,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Union>,
             (Id<mathiu::impl::Union> *)&local_130);
  local_198 = local_e8;
  p_Stack_190 = p_Stack_e0;
  local_4a0 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> *)this;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&local_188,(Id<mathiu::impl::Union> *)&local_d8[0]._M_first)
  ;
  local_140 = local_90;
  IStack_138 = IStack_88;
  uStack_137 = uStack_87;
  local_408 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)
              &matchit::impl::deref;
  _Stack_400 = local_198;
  p_Stack_3f8 = p_Stack_190;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&local_3f0._M_first,(Id<mathiu::impl::Union> *)&local_188);
  local_3a8 = local_140;
  IStack_3a0 = IStack_138;
  uStack_39f = uStack_137;
  local_488 = local_408;
  lStack_480 = (long)_Stack_400;
  local_478 = p_Stack_3f8;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&_Stack_470._M_first,
             (Id<mathiu::impl::Union> *)&local_3f0._M_first);
  local_428 = local_3a8;
  IStack_420 = IStack_3a0;
  uStack_41f = uStack_39f;
  local_418 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_410 = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)&local_3f0._M_first);
  local_398._M_dataplus._M_p = "";
  local_398._M_string_length = (size_type)local_488;
  local_398.field_2._M_allocated_capacity = lStack_480;
  local_398.field_2._8_8_ = local_478;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&local_378,(Id<mathiu::impl::Union> *)&_Stack_470._M_first);
  local_330 = local_428;
  IStack_328 = IStack_420;
  uStack_327 = uStack_41f;
  uStack_317 = uStack_40f;
  IStack_318 = IStack_410;
  local_320 = local_418;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)&_Stack_470._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage(&local_188);
  local_308._M_dataplus._M_p = local_398._M_dataplus._M_p;
  local_308._M_string_length = local_398._M_string_length;
  local_308.field_2._M_allocated_capacity = local_398.field_2._M_allocated_capacity;
  local_308.field_2._8_8_ = local_398.field_2._8_8_;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&local_2e8,(Id<mathiu::impl::Union> *)&local_378);
  p_Var5 = local_4a0;
  local_2a0 = local_330;
  IStack_298 = IStack_328;
  uStack_297 = uStack_327;
  local_290 = local_320;
  IStack_288 = IStack_318;
  uStack_287 = uStack_317;
  local_238 = (undefined1  [8])local_308._M_dataplus._M_p;
  auStack_230._0_8_ = local_308._M_string_length;
  auStack_230._8_8_ = local_308.field_2._M_allocated_capacity;
  auStack_230._16_8_ = local_308.field_2._8_8_;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&_Stack_218._M_first,(Id<mathiu::impl::Union> *)&local_2e8);
  local_1d0.mUnary = local_2a0;
  local_1d0.mPattern = IStack_298;
  local_1d0._9_7_ = uStack_297;
  local_1c0.mUnary = local_290;
  local_1c0.mPattern = IStack_288;
  local_1c0._9_7_ = uStack_287;
  local_1a8 = local_498;
  local_488 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
  local_478 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_470._8_8_ = 0;
  _Stack_470._24_8_ = 0;
  _Stack_470._40_8_ = 0;
  _Stack_470._56_8_ = 0;
  lStack_480 = 0;
  _Stack_470._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>_*>)0x0;
  _Stack_470._16_8_ = 0;
  _Stack_470._32_8_ = 0;
  _Stack_470._48_8_ = 0;
  uStack_430 = 0;
  local_428 = (anon_class_1_0_00000001 *)0x0;
  local_408 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
  if (*(__index_type *)((long)_Var9 + 0x38) == '\x12') {
    local_408 = _Var9;
  }
  local_1b0 = &local_78;
  local_1a0 = symbol;
  std::
  variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
  ::operator=((variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
               *)&local_488._M_first,
              (pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>
               **)&local_408);
  lVar1 = (long)local_428 * 2;
  local_428 = (anon_class_1_0_00000001 *)((long)local_428 + 1);
  value = std::
          get<1ul,std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                    ((variant<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                      *)&(&local_488)[lVar1]._M_first);
  bVar2 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*&,matchit::impl::Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>>
                    (value,&local_260,2,
                     (Context<const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool>
                      *)&local_488._M_first);
  if (bVar2) {
    functionRangeImplIntervalDomain
              ((Interval *)&local_408._M_first,(ExprPtr *)local_250,local_248,local_240);
    _Var4 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)operator_new(0x50);
    *(undefined8 *)((long)_Var4 + 8) = 0x100000001;
    *(undefined ***)_Var4 = &PTR___Sp_counted_ptr_inplace_00263778;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var4 + 0x10))->_vptr__Sp_counted_base =
         (_func_int **)local_408;
    *(_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var4 + 0x10))->_M_use_count =
         _Stack_400;
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var4 + 0x20))->_vptr__Sp_counted_base
         = p_Stack_3f8._0_1_;
    *(_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>_*> *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var4 + 0x20))->_M_use_count =
         local_3f0._M_rest;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var4 + 0x30))->_vptr__Sp_counted_base =
         (_func_int **)local_3f0._8_8_;
    *(uchar *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var4 + 0x30))->_M_use_count
         = local_3f0._M_first._M_storage._M_storage[0x10];
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var4 + 0x40))->_M_use_count = 0x12;
    _Var9 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)
            ((long)_Var4 + 0x10);
  }
  else {
    local_488 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
    local_478 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_470._8_8_ = 0;
    _Stack_470._24_8_ = 0;
    _Stack_470._40_8_ = 0;
    _Stack_470._56_8_ = 0;
    lStack_480 = 0;
    _Stack_470._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>_*>)0x0;
    _Stack_470._16_8_ = 0;
    _Stack_470._32_8_ = 0;
    _Stack_470._48_8_ = 0;
    uStack_430 = 0;
    local_428 = (anon_class_1_0_00000001 *)0x0;
    local_408 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
    if (*(__index_type *)((long)_Var9 + 0x38) == '\x16') {
      local_408 = _Var9;
    }
    std::
    variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
    ::operator=((variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                 *)&local_488._M_first,(SetOp **)&local_408);
    lVar1 = (long)local_428 * 2;
    local_428 = (anon_class_1_0_00000001 *)((long)local_428 + 1);
    p_Var5 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> *)
             std::
             get<2ul,std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                       ((variant<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                         *)&(&local_488)[lVar1]._M_first);
    bVar2 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<mathiu::impl::SetOp_const*&,matchit::impl::Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>>
                      ((SetOp **)p_Var5,&local_1c0,2,
                       (Context<const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool>
                        *)&local_488._M_first);
    if (bVar2) {
      local_408 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
      if (*(__index_type *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)*p_Var5 + 0x30))->
            _vptr__Sp_counted_base == '\0') {
        local_408 = *p_Var5;
      }
      std::
      variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
      ::operator=((variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                   *)&(&local_488)[(long)local_428 * 2]._M_first,(Union **)&local_408);
      lVar1 = (long)local_428 * 2;
      local_428 = (anon_class_1_0_00000001 *)((long)local_428 + 1);
      value_00 = std::
                 get<3ul,std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                           ((variant<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                             *)&(&local_488)[lVar1]._M_first);
      bVar2 = matchit::impl::
              PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
              ::
              matchPatternImpl<mathiu::impl::Union_const*&,matchit::impl::Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>>
                        (value_00,&local_1d0,5,
                         (Context<const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool>
                          *)&local_488._M_first);
      if (bVar2) {
        bVar2 = matchit::impl::Id<mathiu::impl::Union>::matchValue<mathiu::impl::Union_const&>
                          ((Id<mathiu::impl::Union> *)&_Stack_218._M_first,*value_00);
        idProcess = (IdProcess)bVar2;
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                  ((Id<mathiu::impl::Union> *)&_Stack_218._M_first,6,idProcess);
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                  ((Id<mathiu::impl::Union> *)&_Stack_218._M_first,5,(uint)bVar2);
      }
      else {
        idProcess = kCANCEL;
      }
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                ((Id<mathiu::impl::Union> *)&_Stack_218._M_first,4,idProcess);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                ((Id<mathiu::impl::Union> *)&_Stack_218._M_first,3,idProcess);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                ((Id<mathiu::impl::Union> *)&_Stack_218._M_first,2,idProcess);
    }
    else {
      idProcess = kCANCEL;
    }
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
              ((Id<mathiu::impl::Union> *)&_Stack_218._M_first,1,idProcess);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
              ((Id<mathiu::impl::Union> *)&_Stack_218._M_first,0,idProcess);
    if (idProcess == kCANCEL) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Mismatch in functionRangeImpl!");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_4b8 = false_;
    _Stack_4b0 = DAT_0026d688;
    if (DAT_0026d688 != (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)((long)DAT_0026d688 + 8) = *(_Atomic_word *)((long)DAT_0026d688 + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)((long)DAT_0026d688 + 8) = *(_Atomic_word *)((long)DAT_0026d688 + 8) + 1;
      }
    }
    pIVar6 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Union>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Union>&)_1_,matchit::impl::Id<mathiu::impl::Union>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Union>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Union>,matchit::impl::IdBlock<mathiu::impl::Union>*>&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                         *)&local_408._M_first,
                        (variant<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                         *)&local_1b0->_M_first);
    pUVar7 = std::
             visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(mathiu::impl::Union_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(mathiu::impl::Union_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(mathiu::impl::Union*)_1_,matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Union,mathiu::impl::Union*,mathiu::impl::Union_const*>const&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                         *)&local_408._M_first,
                        &(pIVar6->super_IdBlockBase<mathiu::impl::Union>).mVariant);
    p_Var8 = (pUVar7->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var10 = &(pUVar7->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header;
    _Var9 = local_4b8;
    _Var4 = _Stack_4b0;
    p_Var5 = local_4a0;
    if ((_Rb_tree_header *)p_Var8 != p_Var10) {
      do {
        functionRangeImpl((impl *)&local_198._M_first,(ExprPtr *)local_1a8,local_1a0,
                          (ExprPtr *)(p_Var8 + 1));
        union_((impl *)&local_408._M_first,(ExprPtr *)&local_4b8._M_first,
               (ExprPtr *)&local_198._M_first);
        _Var4 = _Stack_400;
        local_4b8 = local_408;
        _Var9 = _Stack_4b0;
        local_408 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
        _Stack_400 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
        _Stack_4b0 = _Var4;
        if ((_Var9 != (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9),
           _Stack_400 != (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0))
        {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_400);
        }
        if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        _Var9 = local_4b8;
        _Var4 = _Stack_4b0;
        p_Var5 = local_4a0;
      } while ((_Rb_tree_header *)p_Var8 != p_Var10);
    }
  }
  *p_Var5 = _Var9;
  p_Var5[1] = _Var4;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)&_Stack_218._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage(&local_2e8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage(&local_378);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)&local_d8[0]._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage(&local_130);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"functionRangeImpl: ",0x13);
  toString_abi_cxx11_((string *)local_238,local_498,ex_02);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_238,auStack_230._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\t",2);
  toString_abi_cxx11_(&local_308,(impl *)symbol,ex_03);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_308._M_dataplus._M_p,local_308._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\t",2);
  toString_abi_cxx11_(&local_398,local_490,ex_04);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_398._M_dataplus._M_p,local_398._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\tresult: ",10);
  toString_abi_cxx11_((string *)&local_488._M_first,(impl *)&p_Var5->_M_first,ex_05);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_488,lStack_480);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_488 != (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)&local_478)
  {
    operator_delete((void *)local_488,(long)local_478 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,(ulong)(local_398.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,(ulong)(local_308.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_238 != (undefined1  [8])(auStack_230 + 8)) {
    operator_delete((void *)local_238,(ulong)(auStack_230._8_8_ + 1));
  }
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)&local_78._M_first);
  EVar11.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  EVar11.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p_Var5;
  return (ExprPtr)EVar11.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr functionRangeImpl(ExprPtr const &function, ExprPtr const &symbol, ExprPtr const &domain)
    {
#if DEBUG
        std::cout << "functionRangeImpl: " << toString(function) << ",\t" << toString(symbol) << ",\t" << toString(domain) << std::endl;
#endif // DEBUG

        Id<Union> iUnion;
        auto result = match(*domain)(
            pattern | as<Interval>(_) = [&]
            { return makeSharedExprPtr(functionRangeImplIntervalDomain(function, symbol, domain)); },
            pattern | as<SetOp>(as<Union>(iUnion)) = [&]
            {
                ExprPtr result = false_;
                for (auto &&e : *iUnion)
                {
                    result = union_(result, functionRangeImpl(function, symbol, e));
                }
                return result;
            },
            pattern | _ = [&]
            {
                throw std::logic_error{"Mismatch in functionRangeImpl!"};
                return false_;
            });
#if DEBUG
        std::cout << "functionRangeImpl: " << toString(function) << ",\t" << toString(symbol) << ",\t" << toString(domain) << ",\tresult: " << toString(result) << std::endl;
#endif // DEBUG

        return result;
    }